

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O2

BOOL has_tok_dollar_reg(List *ls,int number)

{
  BOOL BVar1;
  
  while( true ) {
    if (ls == (List *)0x0) {
      return FALSE;
    }
    if (((ls->token).type - TOK_DOLLAR_DATA_REGISTER < 3) &&
       ((uint)(ls->token).u.reginfo.which == number)) break;
    BVar1 = has_tok_dollar_reg(ls->car,number);
    if (BVar1 != FALSE) {
      return TRUE;
    }
    ls = ls->cdr;
  }
  return TRUE;
}

Assistant:

static BOOL
has_tok_dollar_reg (List *ls, int number)
{
  if (ls == NULL)
    return FALSE;
  if ((ls->token.type == TOK_DOLLAR_DATA_REGISTER
       || ls->token.type == TOK_DOLLAR_ADDRESS_REGISTER
       || ls->token.type == TOK_DOLLAR_GENERAL_REGISTER)
      && ls->token.u.dollarinfo.which == number)
    return TRUE;
  return (has_tok_dollar_reg (ls->car, number)
	  || has_tok_dollar_reg (ls->cdr, number));
}